

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

char * slurpfile(size_t *sizep,char *fmt,...)

{
  char in_AL;
  int __fd;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_21a8 [16];
  undefined8 local_2198;
  undefined8 local_2190;
  undefined8 local_2188;
  undefined8 local_2180;
  undefined8 local_2178;
  undefined8 local_2168;
  undefined8 local_2158;
  undefined8 local_2148;
  undefined8 local_2138;
  undefined8 local_2128;
  undefined8 local_2118;
  undefined8 local_2108;
  int local_20f4;
  FILE *pFStack_20f0;
  wchar_t r;
  FILE *f;
  ssize_t bytes_read;
  char *p;
  va_list ap;
  undefined1 local_20b8 [8];
  stat st;
  char filename [8192];
  char *fmt_local;
  size_t *sizep_local;
  
  if (in_AL != '\0') {
    local_2178 = in_XMM0_Qa;
    local_2168 = in_XMM1_Qa;
    local_2158 = in_XMM2_Qa;
    local_2148 = in_XMM3_Qa;
    local_2138 = in_XMM4_Qa;
    local_2128 = in_XMM5_Qa;
    local_2118 = in_XMM6_Qa;
    local_2108 = in_XMM7_Qa;
  }
  ap[0].overflow_arg_area = local_21a8;
  ap[0]._0_8_ = &stack0x00000008;
  p._4_4_ = 0x30;
  p._0_4_ = 0x10;
  local_2198 = in_RDX;
  local_2190 = in_RCX;
  local_2188 = in_R8;
  local_2180 = in_R9;
  vsnprintf((char *)(st.__glibc_reserved + 2),0x2000,fmt,&p);
  pFStack_20f0 = fopen((char *)(st.__glibc_reserved + 2),"rb");
  if (pFStack_20f0 == (FILE *)0x0) {
    sizep_local = (size_t *)0x0;
  }
  else {
    __fd = fileno(pFStack_20f0);
    local_20f4 = fstat(__fd,(stat *)local_20b8);
    if (local_20f4 == 0) {
      bytes_read = (ssize_t)malloc(st.st_rdev + 1);
      if ((void *)bytes_read == (void *)0x0) {
        logprintf("Can\'t allocate %ld bytes of memory to read file %s\n",st.st_rdev,
                  st.__glibc_reserved + 2);
        fclose(pFStack_20f0);
        sizep_local = (size_t *)0x0;
      }
      else {
        f = (FILE *)fread((void *)bytes_read,1,st.st_rdev,pFStack_20f0);
        if ((long)f < (long)st.st_rdev) {
          logprintf("Can\'t read file %s\n",st.__glibc_reserved + 2);
          fclose(pFStack_20f0);
          free((void *)bytes_read);
          sizep_local = (size_t *)0x0;
        }
        else {
          *(undefined1 *)(bytes_read + st.st_rdev) = 0;
          if (sizep != (size_t *)0x0) {
            *sizep = st.st_rdev;
          }
          fclose(pFStack_20f0);
          sizep_local = (size_t *)bytes_read;
        }
      }
    }
    else {
      logprintf("Can\'t stat file %s\n",st.__glibc_reserved + 2);
      fclose(pFStack_20f0);
      sizep_local = (size_t *)0x0;
    }
  }
  return (char *)sizep_local;
}

Assistant:

char *
slurpfile(size_t * sizep, const char *fmt, ...)
{
	char filename[8192];
	struct stat st;
	va_list ap;
	char *p;
	ssize_t bytes_read;
	FILE *f;
	int r;

	va_start(ap, fmt);
	vsnprintf(filename, sizeof(filename), fmt, ap);
	va_end(ap);

	f = fopen(filename, "rb");
	if (f == NULL) {
		/* Note: No error; non-existent file is okay here. */
		return (NULL);
	}
	r = fstat(fileno(f), &st);
	if (r != 0) {
		logprintf("Can't stat file %s\n", filename);
		fclose(f);
		return (NULL);
	}
	p = malloc((size_t)st.st_size + 1);
	if (p == NULL) {
		logprintf("Can't allocate %ld bytes of memory to read file %s\n",
		    (long int)st.st_size, filename);
		fclose(f);
		return (NULL);
	}
	bytes_read = fread(p, 1, (size_t)st.st_size, f);
	if (bytes_read < st.st_size) {
		logprintf("Can't read file %s\n", filename);
		fclose(f);
		free(p);
		return (NULL);
	}
	p[st.st_size] = '\0';
	if (sizep != NULL)
		*sizep = (size_t)st.st_size;
	fclose(f);
	return (p);
}